

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O1

bool __thiscall
OSSLEDDSA::deriveKey
          (OSSLEDDSA *this,SymmetricKey **ppSymmetricKey,PublicKey *publicKey,PrivateKey *privateKey
          )

{
  int iVar1;
  EVP_PKEY *peer;
  EVP_PKEY *pkey;
  EVP_PKEY_CTX *ctx;
  uchar *key;
  SymmetricKey *this_00;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  size_t len;
  ByteString secret;
  size_t local_50;
  ByteString local_48;
  
  if (privateKey == (PrivateKey *)0x0 ||
      (publicKey == (PublicKey *)0x0 || ppSymmetricKey == (SymmetricKey **)0x0)) {
    return false;
  }
  peer = (EVP_PKEY *)OSSLEDPublicKey::getOSSLKey((OSSLEDPublicKey *)publicKey);
  pkey = (EVP_PKEY *)OSSLEDPrivateKey::getOSSLKey((OSSLEDPrivateKey *)privateKey);
  if (peer == (EVP_PKEY *)0x0 || pkey == (EVP_PKEY *)0x0) {
    pcVar4 = "Failed to get OpenSSL ECDH keys";
    iVar1 = 0x12d;
LAB_001205ed:
    softHSMLog(3,"deriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,iVar1,pcVar4);
    return false;
  }
  ctx = EVP_PKEY_CTX_new(pkey,(ENGINE *)0x0);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    pcVar4 = "Failed to get OpenSSL ECDH context";
    iVar1 = 0x136;
    goto LAB_001205ed;
  }
  iVar1 = EVP_PKEY_derive_init(ctx);
  if (iVar1 < 1) {
    pcVar4 = "Failed to init OpenSSL key derive";
    iVar1 = 0x13c;
LAB_00120660:
    softHSMLog(3,"deriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,iVar1,pcVar4);
    EVP_PKEY_CTX_free(ctx);
    return false;
  }
  iVar1 = EVP_PKEY_derive_set_peer(ctx,peer);
  if (iVar1 < 1) {
    pcVar4 = "Failed to set OpenSSL ECDH public key";
    iVar1 = 0x143;
    goto LAB_00120660;
  }
  iVar1 = EVP_PKEY_derive(ctx,(uchar *)0x0,&local_50);
  if (iVar1 < 1) {
    pcVar4 = "Failed to get OpenSSL ECDH key length";
    iVar1 = 0x14d;
    goto LAB_00120660;
  }
  ByteString::ByteString(&local_48);
  ByteString::resize(&local_48,local_50);
  key = ByteString::operator[](&local_48,0);
  iVar1 = EVP_PKEY_derive(ctx,key,&local_50);
  if (iVar1 < 1) {
    softHSMLog(3,"deriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,0x156,"Failed to derive OpenSSL ECDH secret");
    EVP_PKEY_CTX_free(ctx);
  }
  else {
    EVP_PKEY_CTX_free(ctx);
    this_00 = (SymmetricKey *)operator_new(0x38);
    sVar2 = ByteString::size(&local_48);
    SymmetricKey::SymmetricKey(this_00,sVar2 << 3);
    *ppSymmetricKey = this_00;
    iVar1 = (*(this_00->super_Serialisable)._vptr_Serialisable[3])(this_00,&local_48);
    bVar3 = true;
    if ((char)iVar1 != '\0') goto LAB_001206a1;
    if (*ppSymmetricKey != (SymmetricKey *)0x0) {
      (*((*ppSymmetricKey)->super_Serialisable)._vptr_Serialisable[2])();
    }
    *ppSymmetricKey = (SymmetricKey *)0x0;
  }
  bVar3 = false;
LAB_001206a1:
  local_48._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_48.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool OSSLEDDSA::deriveKey(SymmetricKey **ppSymmetricKey, PublicKey* publicKey, PrivateKey* privateKey)
{
	// Check parameters
	if ((ppSymmetricKey == NULL) ||
	    (publicKey == NULL) ||
	    (privateKey == NULL))
	{
		return false;
	}

	// Get keys
	EVP_PKEY *pub = ((OSSLEDPublicKey *)publicKey)->getOSSLKey();
	EVP_PKEY *priv = ((OSSLEDPrivateKey *)privateKey)->getOSSLKey();
	if (pub == NULL || priv == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH keys");

		return false;
	}

	// Get and set context
	EVP_PKEY_CTX *ctx = EVP_PKEY_CTX_new(priv, NULL);
	if (ctx == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH context");

		return false;
	}
	if (EVP_PKEY_derive_init(ctx) <= 0)
	{
		ERROR_MSG("Failed to init OpenSSL key derive");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	if (EVP_PKEY_derive_set_peer(ctx, pub) <= 0)
	{
		ERROR_MSG("Failed to set OpenSSL ECDH public key");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}

	// Derive the secret
	size_t len;
	if (EVP_PKEY_derive(ctx, NULL, &len) <= 0)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH key length");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	ByteString secret;
	secret.resize(len);
	if (EVP_PKEY_derive(ctx, &secret[0], &len) <= 0)
	{
		ERROR_MSG("Failed to derive OpenSSL ECDH secret");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	EVP_PKEY_CTX_free(ctx);

	// Create derived key
	*ppSymmetricKey = new SymmetricKey(secret.size() * 8);
	if (*ppSymmetricKey == NULL)
		return false;
	if (!(*ppSymmetricKey)->setKeyBits(secret))
	{
		delete *ppSymmetricKey;
		*ppSymmetricKey = NULL;
		return false;
	}

	return true;
}